

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void make_error(png_store *ps,png_byte colour_type,png_byte bit_depth,int interlace_type,int test,
               png_const_charp name)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  png_byte local_608 [8];
  png_byte buffer [1024];
  int local_200;
  png_uint_32 y;
  int pass;
  int npasses;
  jmp_buf exception_env_1;
  jmp_buf *local_128;
  jmp_buf *exception_prev_1;
  png_uint_32 h;
  png_uint_32 w;
  png_structp pp;
  png_infop pi;
  jmp_buf exception__env;
  jmp_buf *exception__prev;
  png_store *fault;
  exception_context *the_exception_context;
  png_const_charp name_local;
  int test_local;
  int interlace_type_local;
  png_byte bit_depth_local;
  png_byte colour_type_local;
  png_store *ps_local;
  
  exception__env[0].__saved_mask.__val[0xf] = (unsigned_long)(ps->exception_context).penv;
  (ps->exception_context).penv = (jmp_buf *)&pi;
  iVar1 = _setjmp((__jmp_buf_tag *)&pi);
  if (iVar1 == 0) {
    do {
      _h = set_store_for_write(ps,(png_infopp)&pp,name);
      make_volatile_for_gnu = &h;
      if (_h == (png_structp)0x0) {
        (ps->exception_context).v.etmp = ps;
        longjmp((__jmp_buf_tag *)(ps->exception_context).penv,1);
      }
      exception_prev_1._4_4_ = 0x80;
      make_volatile_for_gnu = (void *)((long)&exception_prev_1 + 4);
      exception_prev_1._0_4_ = transform_height(_h,colour_type,bit_depth);
      make_volatile_for_gnu = &exception_prev_1;
      png_set_IHDR(_h,pp,exception_prev_1._4_4_,(png_uint_32)exception_prev_1,bit_depth,colour_type,
                   interlace_type,0,0);
      if (colour_type == '\x03') {
        init_standard_palette(ps,_h,(png_infop)pp,1 << (bit_depth & 0x1f),0);
      }
      local_128 = (ps->exception_context).penv;
      (ps->exception_context).penv = (jmp_buf *)&pass;
      iVar1 = _setjmp((__jmp_buf_tag *)&pass);
      if (iVar1 == 0) {
        do {
          make_volatile_for_gnu = &local_128;
          ps->field_0x18 = ps->field_0x18 & 0xfb | ((error_test[test].field_0x10 & 1) == 0) << 2;
          ps->field_0x18 = ps->field_0x18 & 0xf7 | (error_test[test].field_0x10 & 1) << 3;
          ps->field_0x18 = ps->field_0x18 & 0xef;
          (*error_test[test].fn)(_h,(png_infop)pp);
          png_write_info(_h,pp);
          if ((((byte)ps->field_0x18 >> 3 & 1) != 0) && (((byte)ps->field_0x18 >> 4 & 1) != 0)) {
            (ps->exception_context).v.etmp = ps;
            longjmp((__jmp_buf_tag *)(ps->exception_context).penv,1);
          }
          store_log(ps,_h,error_test[test].msg,1);
          (ps->exception_context).caught = 0;
        } while ((ps->exception_context).caught != 0);
      }
      else {
        (ps->exception_context).caught = 1;
      }
      (ps->exception_context).penv = local_128;
      ps->field_0x18 = ps->field_0x18 & 0xf7;
      if (((byte)ps->field_0x18 >> 2 & 1) == 0) {
        sVar3 = png_get_rowbytes(_h,pp);
        sVar4 = transform_rowsize(_h,colour_type,bit_depth);
        if (sVar3 != sVar4) {
          png_error(_h,"row size incorrect");
        }
        iVar1 = png_set_interlace_handling(_h);
        iVar2 = npasses_from_interlace_type(_h,interlace_type);
        if (iVar1 != iVar2) {
          png_error(_h,"write: png_set_interlace_handling failed");
        }
        for (local_200 = 0; local_200 < iVar1; local_200 = local_200 + 1) {
          buffer[0x3fc] = '\0';
          buffer[0x3fd] = '\0';
          buffer[0x3fe] = '\0';
          buffer[0x3ff] = '\0';
          for (; (uint)buffer._1020_4_ < (png_uint_32)exception_prev_1;
              buffer._1020_4_ = buffer._1020_4_ + 1) {
            transform_row(_h,local_608,colour_type,bit_depth,buffer._1020_4_);
            png_write_row(_h,local_608);
          }
        }
        png_write_end(_h,pp);
      }
      else {
        ps->field_0x18 = ps->field_0x18 & 0xfb;
      }
      store_write_reset(ps);
      (ps->exception_context).caught = 0;
    } while ((ps->exception_context).caught != 0);
  }
  else {
    (ps->exception_context).caught = 1;
  }
  (ps->exception_context).penv = (jmp_buf *)exception__env[0].__saved_mask.__val[0xf];
  if ((ps->exception_context).caught != 0) {
    store_write_reset((ps->exception_context).v.etmp);
  }
  return;
}

Assistant:

static void
make_error(png_store* const ps, png_byte const colour_type,
    png_byte bit_depth, int interlace_type, int test, png_const_charp name)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp = set_store_for_write(ps, &pi, name);
      png_uint_32 w, h;
      gnu_volatile(pp)

      if (pp == NULL)
         Throw ps;

      w = transform_width(pp, colour_type, bit_depth);
      gnu_volatile(w)
      h = transform_height(pp, colour_type, bit_depth);
      gnu_volatile(h)
      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
            PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 0/*do tRNS*/);

      /* Time for a few errors; these are in various optional chunks, the
       * standard tests test the standard chunks pretty well.
       */
#     define exception__prev exception_prev_1
#     define exception__env exception_env_1
      Try
      {
         gnu_volatile(exception__prev)

         /* Expect this to throw: */
         ps->expect_error = !error_test[test].warning;
         ps->expect_warning = error_test[test].warning;
         ps->saw_warning = 0;
         error_test[test].fn(pp, pi);

         /* Normally the error is only detected here: */
         png_write_info(pp, pi);

         /* And handle the case where it was only a warning: */
         if (ps->expect_warning && ps->saw_warning)
            Throw ps;

         /* If we get here there is a problem, we have success - no error or
          * no warning - when we shouldn't have success.  Log an error.
          */
         store_log(ps, pp, error_test[test].msg, 1 /*error*/);
      }

      Catch (fault)
      { /* expected exit */
      }
#undef exception__prev
#undef exception__env

      /* And clear these flags */
      ps->expect_warning = 0;

      if (ps->expect_error)
         ps->expect_error = 0;

      else
      {
         /* Now write the whole image, just to make sure that the detected, or
          * undetected, error has not created problems inside libpng.  This
          * doesn't work if there was a png_error in png_write_info because that
          * can abort before PLTE was written.
          */
         if (png_get_rowbytes(pp, pi) !=
             transform_rowsize(pp, colour_type, bit_depth))
            png_error(pp, "row size incorrect");

         else
         {
            int npasses = set_write_interlace_handling(pp, interlace_type);
            int pass;

            if (npasses != npasses_from_interlace_type(pp, interlace_type))
               png_error(pp, "write: png_set_interlace_handling failed");

            for (pass=0; pass<npasses; ++pass)
            {
               png_uint_32 y;

               for (y=0; y<h; ++y)
               {
                  png_byte buffer[TRANSFORM_ROWMAX];

                  transform_row(pp, buffer, colour_type, bit_depth, y);

#                 if do_own_interlace
                     /* If do_own_interlace *and* the image is interlaced we
                      * need a reduced interlace row; this may be reduced to
                      * empty.
                      */
                     if (interlace_type == PNG_INTERLACE_ADAM7)
                     {
                        /* The row must not be written if it doesn't exist,
                         * notice that there are two conditions here, either the
                         * row isn't ever in the pass or the row would be but
                         * isn't wide enough to contribute any pixels.  In fact
                         * the wPass test can be used to skip the whole y loop
                         * in this case.
                         */
                        if (PNG_ROW_IN_INTERLACE_PASS(y, pass) &&
                            PNG_PASS_COLS(w, pass) > 0)
                           interlace_row(buffer, buffer,
                                 bit_size(pp, colour_type, bit_depth), w, pass,
                                 0/*data always bigendian*/);
                        else
                           continue;
                     }
#                 endif /* do_own_interlace */

                  png_write_row(pp, buffer);
               }
            }
         } /* image writing */

         png_write_end(pp, pi);
      }

      /* The following deletes the file that was just written. */
      store_write_reset(ps);
   }

   Catch(fault)
   {
      store_write_reset(fault);
   }
}